

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

void __thiscall Rml::DataParser::Expected(DataParser *this,char expected)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct((ulong)&local_78,'\x01');
  ::std::operator+(&local_58,&local_78,expected);
  ::std::operator+(&local_38,&local_58,'\'');
  Expected(this,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void Expected(char expected) { Expected(String(1, '\'') + expected + '\''); }